

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error raccess_guess_apple_single
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  FT_Int32 magic;
  FT_Long *result_offset_local;
  char **result_file_name_local;
  char *base_file_name_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  *result_file_name = (char *)0x0;
  if (stream == (FT_Stream)0x0) {
    library_local._4_4_ = 0x51;
  }
  else {
    library_local._4_4_ =
         raccess_guess_apple_generic(library,stream,base_file_name,0x51600,result_offset);
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  raccess_guess_apple_single( FT_Library  library,
                              FT_Stream   stream,
                              char       *base_file_name,
                              char      **result_file_name,
                              FT_Long    *result_offset )
  {
    FT_Int32  magic = ( 0x00 << 24 ) |
                      ( 0x05 << 16 ) |
                      ( 0x16 <<  8 ) |
                        0x00;


    *result_file_name = NULL;
    if ( NULL == stream )
      return FT_THROW( Cannot_Open_Stream );

    return raccess_guess_apple_generic( library, stream, base_file_name,
                                        magic, result_offset );
  }